

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

int side1_4d_filter(double *p0,double *p1,double *q0)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  dVar12 = *p0;
  dVar7 = p0[1];
  dVar11 = dVar7 - p1[1];
  dVar1 = p0[2];
  dVar2 = p0[3];
  dVar4 = dVar1 - p1[2];
  dVar5 = dVar2 - p1[3];
  auVar20._0_8_ = ABS(dVar11);
  dVar13 = dVar12 - *p1;
  dVar14 = *p1 - dVar12;
  auVar23._0_8_ = ABS(dVar13);
  auVar23._8_8_ = auVar20._0_8_;
  auVar24._8_4_ = SUB84(auVar23._0_8_,0);
  auVar24._0_8_ = ABS(dVar14);
  auVar24._12_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
  auVar24 = maxpd(auVar23,auVar24);
  dVar15 = p1[1] - dVar7;
  dVar16 = p1[2] - dVar1;
  dVar10 = p1[3] - dVar2;
  auVar20._8_8_ = ABS(dVar4);
  auVar24 = maxpd(auVar20,auVar24);
  auVar25._8_8_ = ABS(dVar5);
  auVar25._0_8_ = ABS(dVar4);
  auVar24 = maxpd(auVar25,auVar24);
  auVar17._8_8_ = ABS(*q0 - dVar12);
  auVar17._0_8_ = ABS(dVar5);
  auVar24 = maxpd(auVar17,auVar24);
  auVar21._0_8_ = ABS(dVar15);
  auVar21._8_8_ = ABS(q0[1] - dVar7);
  auVar24 = maxpd(auVar21,auVar24);
  auVar18._0_8_ = ABS(dVar16);
  auVar18._8_8_ = ABS(q0[2] - dVar1);
  auVar24 = maxpd(auVar18,auVar24);
  auVar8._0_8_ = ABS(dVar10);
  auVar8._8_8_ = ABS(q0[3] - dVar2);
  auVar24 = maxpd(auVar8,auVar24);
  dVar6 = auVar24._0_8_;
  dVar9 = auVar24._8_8_;
  dVar19 = dVar9;
  dVar22 = dVar6;
  if ((dVar9 <= dVar6) && (dVar22 = dVar9, dVar9 < dVar6)) {
    dVar19 = dVar6;
  }
  iVar3 = 0;
  if ((1.8581679070329353e-147 <= dVar22) && (dVar19 <= 5.599361855444509e+101)) {
    dVar12 = (q0[3] - dVar2) * dVar10 +
             (q0[2] - dVar1) * dVar16 + dVar14 * (*q0 - dVar12) + (q0[1] - dVar7) * dVar15;
    dVar12 = (dVar5 * dVar5 + dVar4 * dVar4 + dVar13 * dVar13 + dVar11 * dVar11) - (dVar12 + dVar12)
    ;
    dVar7 = dVar6 * dVar9 * 6.444281772791857e-15;
    if (dVar7 < dVar12) {
      return 1;
    }
    if (dVar12 < -dVar7) {
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

inline int side1_4d_filter( const double* p0, const double* p1, const double* q0) {
    double p0_0_p1_0 = (p0[0] - p1[0]);
    double p0_1_p1_1 = (p0[1] - p1[1]);
    double p0_2_p1_2 = (p0[2] - p1[2]);
    double p0_3_p1_3 = (p0[3] - p1[3]);
    double r;
    r = (1 * ((((p0_0_p1_0 * p0_0_p1_0) + (p0_1_p1_1 * p0_1_p1_1)) + (p0_2_p1_2 * p0_2_p1_2)) + (p0_3_p1_3 * p0_3_p1_3)));
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    r = (r - (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3))));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p1_0_p0_0);
    if( (max1 < fabs(p0_0_p1_0)) )
    {
        max1 = fabs(p0_0_p1_0);
    } 
    if( (max1 < fabs(p0_1_p1_1)) )
    {
        max1 = fabs(p0_1_p1_1);
    } 
    if( (max1 < fabs(p0_2_p1_2)) )
    {
        max1 = fabs(p0_2_p1_2);
    } 
    if( (max1 < fabs(p0_3_p1_3)) )
    {
        max1 = fabs(p0_3_p1_3);
    } 
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_3_p0_3)) )
    {
        max1 = fabs(p1_3_p0_3);
    } 
    double max2 = fabs(p0_0_p1_0);
    if( (max2 < fabs(p0_1_p1_1)) )
    {
        max2 = fabs(p0_1_p1_1);
    } 
    if( (max2 < fabs(p0_2_p1_2)) )
    {
        max2 = fabs(p0_2_p1_2);
    } 
    if( (max2 < fabs(p0_3_p1_3)) )
    {
        max2 = fabs(p0_3_p1_3);
    } 
    if( (max2 < fabs(q0_0_p0_0)) )
    {
        max2 = fabs(q0_0_p0_0);
    } 
    if( (max2 < fabs(q0_1_p0_1)) )
    {
        max2 = fabs(q0_1_p0_1);
    } 
    if( (max2 < fabs(q0_2_p0_2)) )
    {
        max2 = fabs(q0_2_p0_2);
    } 
    if( (max2 < fabs(q0_3_p0_3)) )
    {
        max2 = fabs(q0_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max2;
    upper_bound_1 = max2;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (lower_bound_1 < 1.85816790703293534018e-147) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 5.59936185544450928309e+101) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (6.44428177279185717888e-15 * (max1 * max2));
        if( (r > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}